

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

uchar * EmergencyFindTable_UuidHelper
                  (bool bReverseByteOrder,size_t sizeof_chunk_value,uchar *buffer,uchar *buffer_end,
                  ON__UINT32 expected_tcode,ON_UUID *expected_uuid)

{
  bool bVar1;
  ON__UINT32 OVar2;
  uchar *puVar3;
  bool local_71;
  ON__INT64 local_70;
  ON__INT64 header_length;
  undefined1 local_60 [7];
  bool bLookForUserTableRecordHeader;
  ON_UUID uuid;
  ON__UINT32 cc;
  ON__UINT32 c;
  ON__INT64 chunk_value;
  ON_UUID *expected_uuid_local;
  uchar *puStack_30;
  ON__UINT32 expected_tcode_local;
  uchar *buffer_end_local;
  uchar *buffer_local;
  size_t sizeof_chunk_value_local;
  uchar *puStack_10;
  bool bReverseByteOrder_local;
  
  chunk_value = (ON__INT64)expected_uuid;
  expected_uuid_local._4_4_ = expected_tcode;
  puStack_30 = buffer_end;
  buffer_end_local = buffer;
  buffer_local = (uchar *)sizeof_chunk_value;
  sizeof_chunk_value_local._7_1_ = bReverseByteOrder;
  buffer_end_local = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if (buffer_end_local == (uchar *)0x0) {
    puStack_10 = (uchar *)0x0;
  }
  else {
    _cc = (uchar *)0xffffffffffffffff;
    buffer_end_local =
         BufferToChunkValue((bool)(sizeof_chunk_value_local._7_1_ & 1),(size_t)buffer_local,
                            buffer_end_local,puStack_30,(ON__INT64 *)&cc);
    if ((buffer_end_local == (uchar *)0x0) || ((long)_cc < 0)) {
      puStack_10 = (uchar *)0x0;
    }
    else {
      local_71 = expected_uuid_local._4_4_ == 0x20008080 && buffer_local + 0x31 <= _cc;
      header_length._7_1_ = local_71;
      if ((local_71) || (_cc == (uchar *)0x14)) {
        buffer_end_local =
             BufferToUuid((bool)(sizeof_chunk_value_local._7_1_ & 1),buffer_end_local,puStack_30,
                          (ON_UUID *)local_60);
        if (buffer_end_local == (uchar *)0x0) {
          puStack_10 = (uchar *)0x0;
        }
        else if ((chunk_value == 0) ||
                (bVar1 = operator!=((ON_UUID_struct *)local_60,(ON_UUID_struct *)chunk_value),
                !bVar1)) {
          if ((header_length._7_1_ & 1) != 0) {
            buffer_end_local =
                 BufferValidateTcode((bool)(sizeof_chunk_value_local._7_1_ & 1),buffer_end_local,
                                     puStack_30,0x20008082);
            if (buffer_end_local == (uchar *)0x0) {
              return (uchar *)0x0;
            }
            local_70 = -1;
            puVar3 = BufferToChunkValue((bool)(sizeof_chunk_value_local._7_1_ & 1),
                                        (size_t)buffer_local,buffer_end_local,puStack_30,&local_70);
            if (puVar3 == (uchar *)0x0) {
              return (uchar *)0x0;
            }
            if (local_70 < 0x19) {
              return (uchar *)0x0;
            }
            if ((puStack_30 <= puVar3) || ((long)puStack_30 - (long)puVar3 < local_70)) {
              return (uchar *)0x0;
            }
            buffer_end_local = puVar3 + local_70;
          }
          buffer_end_local =
               BufferToUINT32((bool)(sizeof_chunk_value_local._7_1_ & 1),buffer_end_local,puStack_30
                              ,(ON__UINT32 *)(uuid.Data4 + 4));
          if (buffer_end_local == (uchar *)0x0) {
            puStack_10 = (uchar *)0x0;
          }
          else {
            uuid.Data4._0_4_ = ON_CRC32(0,4,local_60);
            uuid.Data4._0_4_ = ON_CRC32(uuid.Data4._0_4_,2,local_60 + 4);
            uuid.Data4._0_4_ = ON_CRC32(uuid.Data4._0_4_,2,local_60 + 6);
            OVar2 = ON_CRC32(uuid.Data4._0_4_,8,&uuid);
            if (uuid.Data4._4_4_ == OVar2) {
              puStack_10 = buffer_end_local;
            }
            else {
              puStack_10 = (uchar *)0x0;
            }
          }
        }
        else {
          puStack_10 = (uchar *)0x0;
        }
      }
      else {
        puStack_10 = (uchar *)0x0;
      }
    }
  }
  return puStack_10;
}

Assistant:

static
const unsigned char* EmergencyFindTable_UuidHelper( 
          bool bReverseByteOrder,
          size_t sizeof_chunk_value, 
          const unsigned char* buffer,
          const unsigned char* buffer_end,
          const ON__UINT32 expected_tcode,
          const ON_UUID* expected_uuid
          )
{
  ON__INT64 chunk_value;
  ON__UINT32 c, cc;
  ON_UUID uuid;

  // make sure the value at the start of the buffer = expected_tcode.
  buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if ( 0 == buffer )
    return 0;

  // get length of this chunk containing the uuid
  chunk_value = -1;
  buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&chunk_value );
  if ( 0 == buffer || chunk_value < 0 )
    return 0;

  // determine how long the chunk is supposed to be and validate the length.
  //
  // The "16+4+sizeof_chunk_value+21+4+4" in the bLookForUserTableRecordHeader
  // breaks down as:
  //  16                       sizeof(uuid)
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk typecode)
  //  +sizeof_chunk_value    + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk length)
  //  +21                    + major ver, minor ver, bool, archive ver, 3dm ver
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk crc)
  //  +4                     + sizeof(TCODE_USER_TABLE_UUID chunk crc)
  const bool bLookForUserTableRecordHeader = (TCODE_USER_TABLE_UUID == expected_tcode
                                              && ((ON__UINT64)chunk_value) >= (16+4+sizeof_chunk_value+21+4+4)
                                             );
  if ( !bLookForUserTableRecordHeader && 20 != chunk_value )
    return 0;
  buffer = BufferToUuid(bReverseByteOrder,buffer,buffer_end,uuid);
  if ( 0 == buffer )
    return 0;
  if( 0 != expected_uuid && uuid != *expected_uuid )
    return 0;
  
  if ( bLookForUserTableRecordHeader )
  {
    // make sure there is a TCODE_USER_TABLE_RECORD_HEADER chunk and skip over it.
    buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,TCODE_USER_TABLE_RECORD_HEADER);
    if ( 0 == buffer )
      return 0;
    // get length of the TCODE_USER_TABLE_RECORD_HEADER chunk
    ON__INT64 header_length = -1;
    buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&header_length );
    if ( 0 == buffer )
      return 0;
    if ( header_length < 25 )
      return 0;
    if ( buffer >= buffer_end || buffer_end - buffer < header_length )
      return 0;
    buffer += header_length;
  }

  buffer = BufferToUINT32(bReverseByteOrder,buffer,buffer_end,&c);
  if ( 0 == buffer )
    return 0;
  cc = ON_CRC32(0,4,&uuid.Data1);
  cc = ON_CRC32(cc,2,&uuid.Data2);
  cc = ON_CRC32(cc,2,&uuid.Data3);
  cc = ON_CRC32(cc,8,&uuid.Data4[0]);
  if ( c != cc )
    return 0;

  return buffer;
}